

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O2

string * __thiscall
vkt::sparse::getImageTypeName_abi_cxx11_
          (string *__return_storage_ptr__,sparse *this,ImageType imageType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "1d";
    __a = &local_9;
    break;
  case 1:
    __s = "1d_array";
    __a = &local_a;
    break;
  case 2:
    __s = "2d";
    __a = &local_b;
    break;
  case 3:
    __s = "2d_array";
    __a = &local_c;
    break;
  case 4:
    __s = "3d";
    __a = &local_d;
    break;
  case 5:
    __s = "cube";
    __a = &local_e;
    break;
  case 6:
    __s = "cube_array";
    __a = &local_f;
    break;
  case 7:
    __s = "buffer";
    __a = &local_10;
    break;
  default:
    __s = "";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getImageTypeName (const ImageType imageType)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:			return "1d";
		case IMAGE_TYPE_1D_ARRAY:	return "1d_array";
		case IMAGE_TYPE_2D:			return "2d";
		case IMAGE_TYPE_2D_ARRAY:	return "2d_array";
		case IMAGE_TYPE_3D:			return "3d";
		case IMAGE_TYPE_CUBE:		return "cube";
		case IMAGE_TYPE_CUBE_ARRAY:	return "cube_array";
		case IMAGE_TYPE_BUFFER:		return "buffer";

		default:
			DE_ASSERT(false);
			return "";
	}
}